

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_generator.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::cpp::CppGenerator::Generate
          (CppGenerator *this,FileDescriptor *file,string *parameter,
          GeneratorContext *generator_context,string *error)

{
  FileDescriptor *file_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Options *pOVar5;
  ulong uVar6;
  undefined4 extraout_var;
  ZeroCopyOutputStream *pZVar8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  LogMessage *pLVar9;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  long *plVar10;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *pAVar11;
  ulong uVar12;
  ulong uVar13;
  int i;
  int i_1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  options;
  allocator local_5b2;
  allocator local_5b1;
  FileDescriptor *local_5b0;
  string *local_5a8;
  string basename;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  string local_570;
  string info_path;
  Printer printer;
  GeneratedCodeInfo annotations;
  Options file_options;
  FileGenerator file_generator;
  ZeroCopyOutputStream *pZVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_07;
  
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ParseGeneratorParameter(parameter,&options);
  file_options.dllexport_decl._M_dataplus._M_p = (pointer)&file_options.dllexport_decl.field_2;
  file_options.dllexport_decl._M_string_length = 0;
  file_options.dllexport_decl.field_2._M_local_buf[0] = '\0';
  file_options.safe_boundary_check = false;
  file_options.proto_h = false;
  file_options.transitive_pb_h = true;
  file_options.annotate_headers = false;
  file_options.enforce_mode = kNoEnforcement;
  file_options.table_driven_parsing = false;
  file_options.table_driven_serialization = false;
  file_options.lite_implicit_weak_fields = false;
  file_options.profile_driven_inline_string = true;
  file_options.force_inline_string = false;
  file_options.runtime_include_base._M_dataplus._M_p =
       (pointer)&file_options.runtime_include_base.field_2;
  file_options.runtime_include_base._M_string_length = 0;
  file_options.runtime_include_base.field_2._M_local_buf[0] = '\0';
  file_options.num_cc_files = 0;
  file_options.annotation_pragma_name._M_dataplus._M_p =
       (pointer)&file_options.annotation_pragma_name.field_2;
  file_options.annotation_pragma_name._M_string_length = 0;
  file_options.annotation_pragma_name.field_2._M_local_buf[0] = '\0';
  file_options.annotation_guard_name._M_dataplus._M_p =
       (pointer)&file_options.annotation_guard_name.field_2;
  file_options.annotation_guard_name._M_string_length = 0;
  file_options.annotation_guard_name.field_2._M_local_buf[0] = '\0';
  file_options.access_info_map = (AccessInfoMap *)0x0;
  file_options.tctable_mode = kTCTableNever;
  file_options.field_listener_options.inject_field_listener_events = false;
  file_options.field_listener_options.forbidden_field_listener_events._M_t._M_impl.
  super__Rb_tree_header._M_header._M_left =
       &file_options.field_listener_options.forbidden_field_listener_events._M_t._M_impl.
        super__Rb_tree_header._M_header;
  file_options.field_listener_options.forbidden_field_listener_events._M_t._M_impl.
  super__Rb_tree_header._M_header._M_color = _S_red;
  file_options.field_listener_options.forbidden_field_listener_events._M_t._M_impl.
  super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  file_options.field_listener_options.forbidden_field_listener_events._M_t._M_impl.
  super__Rb_tree_header._M_node_count = 0;
  file_options.eagerly_verified_lazy = false;
  file_options.force_eagerly_verified_lazy = false;
  file_options._43_4_ = (uint)this->opensource_runtime_ << 8;
  local_5b0 = file;
  local_5a8 = error;
  file_options.field_listener_options.forbidden_field_listener_events._M_t._M_impl.
  super__Rb_tree_header._M_header._M_right =
       file_options.field_listener_options.forbidden_field_listener_events._M_t._M_impl.
       super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_assign((string *)&file_options.runtime_include_base);
  uVar13 = 0;
LAB_00286096:
  file_00 = local_5b0;
  pOVar5 = (Options *)&file_options.annotation_pragma_name;
  if ((ulong)((long)options.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)options.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 6) <= uVar13) goto LAB_00286464;
  bVar1 = std::operator==(&options.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar13].first,"dllexport_decl")
  ;
  if (bVar1) {
    pOVar5 = &file_options;
    goto LAB_002860d3;
  }
  bVar1 = std::operator==(&options.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar13].first,
                          "safe_boundary_check");
  if (bVar1) {
    file_options.safe_boundary_check = true;
  }
  else {
    bVar1 = std::operator==(&options.
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar13].first,
                            "annotate_headers");
    if (bVar1) {
      file_options.annotate_headers = true;
    }
    else {
      bVar1 = std::operator==(&options.
                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar13].first,
                              "annotation_pragma_name");
      if (!bVar1) {
        bVar1 = std::operator==(&options.
                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar13].first,
                                "annotation_guard_name");
        if (!bVar1) {
          bVar1 = std::operator==(&options.
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar13].first,"speed");
          if (bVar1) {
            file_options.enforce_mode = kSpeed;
          }
          else {
            bVar1 = std::operator==(&options.
                                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar13].first,
                                    "code_size");
            if (bVar1) {
              file_options.enforce_mode = kCodeSize;
              goto LAB_0028611e;
            }
            bVar1 = std::operator==(&options.
                                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar13].first,"lite")
            ;
            if (bVar1) {
              file_options.enforce_mode = kLiteRuntime;
            }
            else {
              bVar1 = std::operator==(&options.
                                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar13].first,
                                      "lite_implicit_weak_fields");
              if (bVar1) {
                file_options.enforce_mode = kLiteRuntime;
                file_options.lite_implicit_weak_fields = true;
                if (options.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar13].second._M_string_length != 0)
                {
                  file_options.num_cc_files =
                       strto32_adaptor(options.
                                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar13].second.
                                       _M_dataplus._M_p,(char **)0x0,10);
                }
              }
              else {
                bVar1 = std::operator==(&options.
                                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[uVar13].first,
                                        "annotate_accessor");
                if (bVar1) {
                  file_options.annotate_accessor = true;
                }
                else {
                  bVar1 = std::operator==(&options.
                                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar13].first,
                                          "inject_field_listener_events");
                  if (bVar1) {
                    file_options.field_listener_options.inject_field_listener_events = true;
                  }
                  else {
                    bVar1 = std::operator==(&options.
                                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[uVar13].first
                                            ,"forbidden_field_listener_events");
                    if (bVar1) {
                      uVar12 = 0;
                      do {
                        uVar6 = std::__cxx11::string::find_first_of
                                          ((char *)&options.
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar13].
                                                  second,0x3cded9);
                        if (uVar6 == 0xffffffffffffffff) {
                          uVar6 = options.
                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar13].second.
                                  _M_string_length;
                        }
                        if (uVar12 < uVar6) {
                          std::__cxx11::string::substr
                                    ((ulong)&file_generator,
                                     (ulong)&options.
                                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[uVar13].
                                             second);
                          std::
                          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          ::_M_insert_unique<std::__cxx11::string>
                                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                      *)&file_options.field_listener_options.
                                         forbidden_field_listener_events,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&file_generator);
                          std::__cxx11::string::~string((string *)&file_generator);
                        }
                        uVar12 = uVar6 + 1;
                      } while (uVar12 < options.
                                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar13].second.
                                        _M_string_length);
                    }
                    else {
                      bVar1 = std::operator==(&options.
                                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[uVar13].
                                               first,"eagerly_verified_lazy");
                      if (bVar1) {
                        file_options.eagerly_verified_lazy = true;
                      }
                      else {
                        bVar1 = std::operator==(&options.
                                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[uVar13].
                                                 first,"force_eagerly_verified_lazy");
                        if (bVar1) {
                          file_options.force_eagerly_verified_lazy = true;
                        }
                        else {
                          bVar1 = std::operator==(&options.
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar13].
                                                  first,"table_driven_parsing");
                          if (bVar1) {
                            file_options.table_driven_parsing = true;
                          }
                          else {
                            bVar1 = std::operator==(&options.
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar13].
                                                  first,"table_driven_serialization");
                            if (bVar1) {
                              file_options.table_driven_serialization = true;
                            }
                            else {
                              bVar1 = std::operator==(&options.
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar13].
                                                  first,"experimental_tail_call_table_mode");
                              if (!bVar1) {
                                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&file_generator,"Unknown generator option: ",
                                               &options.
                                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start[uVar13].
                                                first);
LAB_00286b59:
                                std::__cxx11::string::operator=
                                          ((string *)local_5a8,(string *)&file_generator);
                                std::__cxx11::string::~string((string *)&file_generator);
                                goto LAB_00286489;
                              }
                              bVar1 = std::operator==(&options.
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar13].
                                                  second,"never");
                              if (bVar1) {
                                file_options.tctable_mode = kTCTableNever;
                              }
                              else {
                                bVar1 = std::operator==(&options.
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar13].
                                                  second,"guarded");
                                if (bVar1) {
                                  file_options.tctable_mode = kTCTableGuarded;
                                }
                                else {
                                  bVar1 = std::operator==(&options.
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar13].
                                                  second,"always");
                                  if (!bVar1) {
                                    std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&file_generator,
                                                  "Unknown value for experimental_tail_call_table_mode: "
                                                  ,&options.
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar13].
                                                  second);
                                    goto LAB_00286b59;
                                  }
                                  file_options.tctable_mode = kTCTableAlways;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          goto LAB_0028611e;
        }
        pOVar5 = (Options *)&file_options.annotation_guard_name;
      }
LAB_002860d3:
      std::__cxx11::string::_M_assign((string *)pOVar5);
    }
  }
LAB_0028611e:
  uVar13 = uVar13 + 1;
  goto LAB_00286096;
LAB_00286464:
  if ((file_options.safe_boundary_check == true) && (file_options.opensource_runtime == true)) {
    std::__cxx11::string::assign((char *)local_5a8);
LAB_00286489:
    bVar1 = false;
    goto LAB_00286999;
  }
  StripProto(&basename,*(string **)local_5b0);
  bVar1 = MaybeBootstrap(&file_options,generator_context,file_options.bootstrap,&basename);
  if (!bVar1) {
    FileGenerator::FileGenerator(&file_generator,file_00,&file_options);
    if (file_options.proto_h == true) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&printer,
                     &basename,".proto.h");
      iVar2 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&printer);
      pZVar7 = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar2);
      std::__cxx11::string::~string((string *)&printer);
      GeneratedCodeInfo::GeneratedCodeInfo(&annotations);
      annotation_collector.super_AnnotationCollector._vptr_AnnotationCollector =
           (_func_int **)&PTR_AddAnnotation_004d7460;
      annotation_collector.annotation_proto_ = &annotations;
      std::operator+(&info_path,&basename,".proto.h.meta");
      pAVar11 = &annotation_collector;
      if (file_options.annotate_headers == false) {
        pAVar11 = (AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)0x0;
      }
      io::Printer::Printer(&printer,pZVar7,'$',&pAVar11->super_AnnotationCollector);
      if (file_options.annotate_headers == true) {
        std::__cxx11::string::string((string *)&local_570,(string *)&info_path);
      }
      else {
        std::__cxx11::string::string((string *)&local_570,"",&local_5b1);
      }
      FileGenerator::GenerateProtoHeader(&file_generator,&printer,&local_570);
      std::__cxx11::string::~string((string *)&local_570);
      if (file_options.annotate_headers == true) {
        iVar2 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&info_path);
        pZVar8 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar2);
        MessageLite::SerializeToZeroCopyStream((MessageLite *)&annotations,pZVar8);
        if (pZVar8 != (ZeroCopyOutputStream *)0x0) {
          (*pZVar8->_vptr_ZeroCopyOutputStream[1])(pZVar8);
        }
      }
      io::Printer::~Printer(&printer);
      std::__cxx11::string::~string((string *)&info_path);
      GeneratedCodeInfo::~GeneratedCodeInfo(&annotations);
      if (pZVar7 != (ZeroCopyOutputStream *)0x0) {
        (*pZVar7->_vptr_ZeroCopyOutputStream[1])(pZVar7);
      }
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&printer,
                   &basename,".pb.h");
    iVar2 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&printer);
    pZVar7 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_01,iVar2);
    std::__cxx11::string::~string((string *)&printer);
    GeneratedCodeInfo::GeneratedCodeInfo(&annotations);
    annotation_collector.super_AnnotationCollector._vptr_AnnotationCollector =
         (_func_int **)&PTR_AddAnnotation_004d7460;
    annotation_collector.annotation_proto_ = &annotations;
    std::operator+(&info_path,&basename,".pb.h.meta");
    pAVar11 = &annotation_collector;
    if (file_options.annotate_headers == false) {
      pAVar11 = (AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)0x0;
    }
    io::Printer::Printer(&printer,pZVar7,'$',&pAVar11->super_AnnotationCollector);
    if (file_options.annotate_headers == true) {
      std::__cxx11::string::string((string *)&local_570,(string *)&info_path);
    }
    else {
      std::__cxx11::string::string((string *)&local_570,"",&local_5b2);
    }
    FileGenerator::GeneratePBHeader(&file_generator,&printer,&local_570);
    std::__cxx11::string::~string((string *)&local_570);
    if (file_options.annotate_headers == true) {
      iVar2 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&info_path);
      pZVar8 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_02,iVar2);
      MessageLite::SerializeToZeroCopyStream((MessageLite *)&annotations,pZVar8);
      if (pZVar8 != (ZeroCopyOutputStream *)0x0) {
        (*pZVar8->_vptr_ZeroCopyOutputStream[1])(pZVar8);
      }
    }
    io::Printer::~Printer(&printer);
    std::__cxx11::string::~string((string *)&info_path);
    GeneratedCodeInfo::~GeneratedCodeInfo(&annotations);
    if (pZVar7 != (ZeroCopyOutputStream *)0x0) {
      (*pZVar7->_vptr_ZeroCopyOutputStream[1])(pZVar7);
    }
    bVar1 = UsingImplicitWeakFields(file_00,&file_options);
    if (bVar1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&printer,
                     &basename,".pb.cc");
      iVar2 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&printer);
      pZVar7 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_03,iVar2);
      std::__cxx11::string::~string((string *)&printer);
      io::Printer::Printer(&printer,pZVar7,'$');
      FileGenerator::GenerateGlobalSource(&file_generator,&printer);
      io::Printer::~Printer(&printer);
      if (pZVar7 != (ZeroCopyOutputStream *)0x0) {
        (*pZVar7->_vptr_ZeroCopyOutputStream[1])(pZVar7);
      }
      iVar2 = (int)((ulong)((long)file_generator.extension_generators_.
                                  super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)file_generator.extension_generators_.
                                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) +
              (int)((ulong)((long)file_generator.message_generators_.
                                  super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)file_generator.message_generators_.
                                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3);
      if (file_options.num_cc_files < 1) {
LAB_002869c4:
        local_5b0 = (FileDescriptor *)CONCAT44(local_5b0._4_4_,iVar2);
      }
      else {
        if (file_options.num_cc_files < iVar2) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)&printer,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_generator.cc"
                     ,0xea);
          pLVar9 = internal::LogMessage::operator<<
                             ((LogMessage *)&printer,
                              "CHECK failed: (num_cc_files) <= (file_options.num_cc_files): ");
          pLVar9 = internal::LogMessage::operator<<
                             (pLVar9,
                              "There must be at least as many numbered .cc files as messages and extensions."
                             );
          internal::LogFinisher::operator=((LogFinisher *)&annotations,pLVar9);
          internal::LogMessage::~LogMessage((LogMessage *)&printer);
          iVar2 = file_options.num_cc_files;
          goto LAB_002869c4;
        }
        local_5b0 = (FileDescriptor *)CONCAT44(local_5b0._4_4_,file_options.num_cc_files);
      }
      for (iVar2 = 0;
          iVar2 < (int)((ulong)((long)file_generator.message_generators_.
                                      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)file_generator.message_generators_.
                                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3);
          iVar2 = iVar2 + 1) {
        anon_unknown_8::NumberedCcFileName((string *)&printer,&basename,iVar2);
        iVar3 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&printer);
        pZVar7 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_05,iVar3);
        std::__cxx11::string::~string((string *)&printer);
        io::Printer::Printer(&printer,pZVar7,'$');
        FileGenerator::GenerateSourceForMessage(&file_generator,iVar2,&printer);
        io::Printer::~Printer(&printer);
        if (pZVar7 != (ZeroCopyOutputStream *)0x0) {
          (*pZVar7->_vptr_ZeroCopyOutputStream[1])(pZVar7);
        }
      }
      for (iVar3 = 0; iVar4 = iVar2 + iVar3,
          iVar3 < (int)((ulong)((long)file_generator.extension_generators_.
                                      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)file_generator.extension_generators_.
                                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3);
          iVar3 = iVar3 + 1) {
        anon_unknown_8::NumberedCcFileName((string *)&printer,&basename,iVar4);
        iVar4 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&printer);
        pZVar7 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_06,iVar4);
        std::__cxx11::string::~string((string *)&printer);
        io::Printer::Printer(&printer,pZVar7,'$');
        FileGenerator::GenerateSourceForExtension(&file_generator,iVar3,&printer);
        io::Printer::~Printer(&printer);
        if (pZVar7 != (ZeroCopyOutputStream *)0x0) {
          (*pZVar7->_vptr_ZeroCopyOutputStream[1])(pZVar7);
        }
      }
      for (; iVar4 < (int)local_5b0; iVar4 = iVar4 + 1) {
        anon_unknown_8::NumberedCcFileName((string *)&printer,&basename,iVar4);
        iVar2 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&printer);
        plVar10 = (long *)CONCAT44(extraout_var_07,iVar2);
        std::__cxx11::string::~string((string *)&printer);
        if (plVar10 != (long *)0x0) {
          (**(code **)(*plVar10 + 8))(plVar10);
        }
      }
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&printer,
                     &basename,".pb.cc");
      iVar2 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&printer);
      pZVar7 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_04,iVar2);
      std::__cxx11::string::~string((string *)&printer);
      io::Printer::Printer(&printer,pZVar7,'$');
      FileGenerator::GenerateSource(&file_generator,&printer);
      io::Printer::~Printer(&printer);
      if (pZVar7 != (ZeroCopyOutputStream *)0x0) {
        (*pZVar7->_vptr_ZeroCopyOutputStream[1])(pZVar7);
      }
    }
    FileGenerator::~FileGenerator(&file_generator);
  }
  std::__cxx11::string::~string((string *)&basename);
  bVar1 = true;
LAB_00286999:
  Options::~Options(&file_options);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&options);
  return bVar1;
}

Assistant:

bool CppGenerator::Generate(const FileDescriptor* file,
                            const std::string& parameter,
                            GeneratorContext* generator_context,
                            std::string* error) const {
  std::vector<std::pair<std::string, std::string> > options;
  ParseGeneratorParameter(parameter, &options);

  // -----------------------------------------------------------------
  // parse generator options

  // If the dllexport_decl option is passed to the compiler, we need to write
  // it in front of every symbol that should be exported if this .proto is
  // compiled into a Windows DLL.  E.g., if the user invokes the protocol
  // compiler as:
  //   protoc --cpp_out=dllexport_decl=FOO_EXPORT:outdir foo.proto
  // then we'll define classes like this:
  //   class FOO_EXPORT Foo {
  //     ...
  //   }
  // FOO_EXPORT is a macro which should expand to __declspec(dllexport) or
  // __declspec(dllimport) depending on what is being compiled.
  //
  Options file_options;

  file_options.opensource_runtime = opensource_runtime_;
  file_options.runtime_include_base = runtime_include_base_;

  for (int i = 0; i < options.size(); i++) {
    if (options[i].first == "dllexport_decl") {
      file_options.dllexport_decl = options[i].second;
    } else if (options[i].first == "safe_boundary_check") {
      file_options.safe_boundary_check = true;
    } else if (options[i].first == "annotate_headers") {
      file_options.annotate_headers = true;
    } else if (options[i].first == "annotation_pragma_name") {
      file_options.annotation_pragma_name = options[i].second;
    } else if (options[i].first == "annotation_guard_name") {
      file_options.annotation_guard_name = options[i].second;
    } else if (options[i].first == "speed") {
      file_options.enforce_mode = EnforceOptimizeMode::kSpeed;
    } else if (options[i].first == "code_size") {
      file_options.enforce_mode = EnforceOptimizeMode::kCodeSize;
    } else if (options[i].first == "lite") {
      file_options.enforce_mode = EnforceOptimizeMode::kLiteRuntime;
    } else if (options[i].first == "lite_implicit_weak_fields") {
      file_options.enforce_mode = EnforceOptimizeMode::kLiteRuntime;
      file_options.lite_implicit_weak_fields = true;
      if (!options[i].second.empty()) {
        file_options.num_cc_files =
            strto32(options[i].second.c_str(), NULL, 10);
      }
    } else if (options[i].first == "annotate_accessor") {
      file_options.annotate_accessor = true;
    } else if (options[i].first == "inject_field_listener_events") {
      file_options.field_listener_options.inject_field_listener_events = true;
    } else if (options[i].first == "forbidden_field_listener_events") {
      std::size_t pos = 0;
      do {
        std::size_t next_pos = options[i].second.find_first_of("+", pos);
        if (next_pos == std::string::npos) {
          next_pos = options[i].second.size();
        }
        if (next_pos > pos)
          file_options.field_listener_options.forbidden_field_listener_events
              .insert(options[i].second.substr(pos, next_pos - pos));
        pos = next_pos + 1;
      } while (pos < options[i].second.size());
    } else if (options[i].first == "eagerly_verified_lazy") {
      file_options.eagerly_verified_lazy = true;
    } else if (options[i].first == "force_eagerly_verified_lazy") {
      file_options.force_eagerly_verified_lazy = true;
    } else if (options[i].first == "table_driven_parsing") {
      file_options.table_driven_parsing = true;
    } else if (options[i].first == "table_driven_serialization") {
      file_options.table_driven_serialization = true;
    } else if (options[i].first == "experimental_tail_call_table_mode") {
      if (options[i].second == "never") {
        file_options.tctable_mode = Options::kTCTableNever;
      } else if (options[i].second == "guarded") {
        file_options.tctable_mode = Options::kTCTableGuarded;
      } else if (options[i].second == "always") {
        file_options.tctable_mode = Options::kTCTableAlways;
      } else {
        *error = "Unknown value for experimental_tail_call_table_mode: " +
                 options[i].second;
        return false;
      }
    } else {
      *error = "Unknown generator option: " + options[i].first;
      return false;
    }
  }

  // The safe_boundary_check option controls behavior for Google-internal
  // protobuf APIs.
  if (file_options.safe_boundary_check && file_options.opensource_runtime) {
    *error =
        "The safe_boundary_check option is not supported outside of Google.";
    return false;
  }

  // -----------------------------------------------------------------


  std::string basename = StripProto(file->name());

  if (MaybeBootstrap(file_options, generator_context, file_options.bootstrap,
                     &basename)) {
    return true;
  }

  FileGenerator file_generator(file, file_options);

  // Generate header(s).
  if (file_options.proto_h) {
    std::unique_ptr<io::ZeroCopyOutputStream> output(
        generator_context->Open(basename + ".proto.h"));
    GeneratedCodeInfo annotations;
    io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
        &annotations);
    std::string info_path = basename + ".proto.h.meta";
    io::Printer printer(
        output.get(), '$',
        file_options.annotate_headers ? &annotation_collector : NULL);
    file_generator.GenerateProtoHeader(
        &printer, file_options.annotate_headers ? info_path : "");
    if (file_options.annotate_headers) {
      std::unique_ptr<io::ZeroCopyOutputStream> info_output(
          generator_context->Open(info_path));
      annotations.SerializeToZeroCopyStream(info_output.get());
    }
  }

  {
    std::unique_ptr<io::ZeroCopyOutputStream> output(
        generator_context->Open(basename + ".pb.h"));
    GeneratedCodeInfo annotations;
    io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
        &annotations);
    std::string info_path = basename + ".pb.h.meta";
    io::Printer printer(
        output.get(), '$',
        file_options.annotate_headers ? &annotation_collector : NULL);
    file_generator.GeneratePBHeader(
        &printer, file_options.annotate_headers ? info_path : "");
    if (file_options.annotate_headers) {
      std::unique_ptr<io::ZeroCopyOutputStream> info_output(
          generator_context->Open(info_path));
      annotations.SerializeToZeroCopyStream(info_output.get());
    }
  }

  // Generate cc file(s).
  if (UsingImplicitWeakFields(file, file_options)) {
    {
      // This is the global .cc file, containing
      // enum/services/tables/reflection
      std::unique_ptr<io::ZeroCopyOutputStream> output(
          generator_context->Open(basename + ".pb.cc"));
      io::Printer printer(output.get(), '$');
      file_generator.GenerateGlobalSource(&printer);
    }

    int num_cc_files =
        file_generator.NumMessages() + file_generator.NumExtensions();

    // If we're using implicit weak fields then we allow the user to
    // optionally specify how many files to generate, not counting the global
    // pb.cc file. If we have more files than messages, then some files will
    // be generated as empty placeholders.
    if (file_options.num_cc_files > 0) {
      GOOGLE_CHECK_LE(num_cc_files, file_options.num_cc_files)
          << "There must be at least as many numbered .cc files as messages "
             "and extensions.";
      num_cc_files = file_options.num_cc_files;
    }
    int cc_file_number = 0;
    for (int i = 0; i < file_generator.NumMessages(); i++) {
      std::unique_ptr<io::ZeroCopyOutputStream> output(generator_context->Open(
          NumberedCcFileName(basename, cc_file_number++)));
      io::Printer printer(output.get(), '$');
      file_generator.GenerateSourceForMessage(i, &printer);
    }
    for (int i = 0; i < file_generator.NumExtensions(); i++) {
      std::unique_ptr<io::ZeroCopyOutputStream> output(generator_context->Open(
          NumberedCcFileName(basename, cc_file_number++)));
      io::Printer printer(output.get(), '$');
      file_generator.GenerateSourceForExtension(i, &printer);
    }
    // Create empty placeholder files if necessary to match the expected number
    // of files.
    for (; cc_file_number < num_cc_files; ++cc_file_number) {
      std::unique_ptr<io::ZeroCopyOutputStream> output(generator_context->Open(
          NumberedCcFileName(basename, cc_file_number)));
    }
  } else {
    std::unique_ptr<io::ZeroCopyOutputStream> output(
        generator_context->Open(basename + ".pb.cc"));
    io::Printer printer(output.get(), '$');
    file_generator.GenerateSource(&printer);
  }

  return true;
}